

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_TestPlanar2D_MFX_JPEG_YUV411R_Test::TestBody
          (CTestResource_TestPlanar2D_MFX_JPEG_YUV411R_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  int iVar2;
  bool bVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  uint ExpectedValue;
  undefined1 auStack_f8 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  uint local_54;
  internal local_50 [4];
  uint32_t YHeight;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  lVar4 = 0;
  do {
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.BaseHeight = 0;
    gmmParams.Depth = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    auStack_f8._0_4_ = RESOURCE_2D;
    auStack_f8._4_4_ = GMM_FORMAT_INVALID;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x101;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x100000101;
    CTestResource::SetTileFlag
              (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)auStack_f8,
               *(TEST_TILE_TYPE *)((long)&DAT_001ad600 + lVar4));
    auStack_f8._4_4_ = GMM_FORMAT_MFX_JPEG_YUV411R;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,(GMM_RESCREATE_PARAMS *)auStack_f8);
    if (lVar4 == 0) {
      ExpectedValue = gmmParams.CpTag + 0x3f & 0xffffffc0;
      local_54 = gmmParams.field_6.BaseWidth + 0xf & 0xfffffff0;
      uVar5 = (gmmParams.field_6.BaseWidth + 3 >> 2) + 0xf & 0xfffffff0;
    }
    else {
      iVar7 = *(int *)((long)&DAT_001ad610 + lVar4 * 2);
      iVar2 = *(int *)((long)&DAT_001ad614 + lVar4 * 2);
      ExpectedValue = -iVar7 & iVar7 + -1 + gmmParams.CpTag;
      local_54 = iVar2 + -1 + (gmmParams.field_6.BaseWidth + 0xf & 0xfffffff0) & -iVar2;
      uVar5 = (((gmmParams.field_6.BaseWidth + 3 >> 2) + 0xf & 0xfffffff0) - 1) + iVar2 & -iVar2;
    }
    iVar7 = uVar5 * 2 + local_54;
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,ExpectedValue);
    if (lVar4 != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                (&this->super_CTestResource,ResourceInfo,
                 ExpectedValue / *(uint *)((long)&DAT_001ad610 + lVar4 * 2));
    }
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo,
               (ulong)(iVar7 * ExpectedValue + 0xfff & 0xfffff000));
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",(int *)&gtest_ar.message_,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      psVar1 = &gtest_ar.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc4e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",(int *)&gtest_ar.message_,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      psVar1 = &gtest_ar.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc4f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",(int *)&gtest_ar.message_,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      psVar1 = &gtest_ar.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc52,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_50,"YHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_54,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      psVar1 = &gtest_ar.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc53,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
    psVar1 = &gtest_ar.message_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",(int *)psVar1,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc56,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = uVar5 + local_54;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_50,"YHeight + VHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",
               (uint *)psVar1,(unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc57,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_MFX_JPEG_YUV411R)
{
    /* Test planar surfaces where both U and V are quarter the size of Y */
    //YYYYYYYY
    //YYYYYYYY
    //YYYYYYYY
    //YYYYYYYY
    //UUUUUUUU
    //VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]       = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t       PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                     {512, 8},   // TileX
                                     {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 0x101;
        gmmParams.BaseHeight           = 0x101;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_MFX_JPEG_YUV411R_TYPE;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;
        uint32_t YHeight, VHeight;
        if(Tile != TEST_LINEAR)
        {
            Pitch   = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            YHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            YHeight = GMM_ULT_ALIGN(YHeight, TileSize[TileIndex][1]);

            VHeight = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseHeight, 4) / 4, PlaneRowAlignment);
            VHeight = GMM_ULT_ALIGN(VHeight, TileSize[TileIndex][1]);
        }
        else
        {
            Pitch   = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
            YHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            VHeight = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseHeight, 4) / 4, PlaneRowAlignment);
        }

        Height        = YHeight + 2 * VHeight;
        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(YHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(YHeight + VHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}